

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void * xmlCopyAttribute(void *payload,xmlChar *name)

{
  xmlAttributePtr attr_00;
  xmlEnumerationPtr pxVar1;
  xmlChar *pxVar2;
  xmlAttributePtr cur;
  xmlAttributePtr attr;
  xmlChar *name_local;
  void *payload_local;
  
  attr_00 = (xmlAttributePtr)(*xmlMalloc)(0x78);
  if (attr_00 == (xmlAttributePtr)0x0) {
    return (void *)0x0;
  }
  memset(attr_00,0,0x78);
  attr_00->type = XML_ATTRIBUTE_DECL;
  attr_00->atype = *(xmlAttributeType *)((long)payload + 0x50);
  attr_00->def = *(xmlAttributeDefault *)((long)payload + 0x54);
  if (*(long *)((long)payload + 0x60) != 0) {
    pxVar1 = xmlCopyEnumeration(*(xmlEnumerationPtr *)((long)payload + 0x60));
    attr_00->tree = pxVar1;
    if (attr_00->tree == (xmlEnumerationPtr)0x0) goto LAB_0017a25f;
  }
  if (*(long *)((long)payload + 0x70) != 0) {
    pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x70));
    attr_00->elem = pxVar2;
    if (attr_00->elem == (xmlChar *)0x0) goto LAB_0017a25f;
  }
  if (*(long *)((long)payload + 0x10) != 0) {
    pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
    attr_00->name = pxVar2;
    if (attr_00->name == (xmlChar *)0x0) goto LAB_0017a25f;
  }
  if (*(long *)((long)payload + 0x68) != 0) {
    pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x68));
    attr_00->prefix = pxVar2;
    if (attr_00->prefix == (xmlChar *)0x0) goto LAB_0017a25f;
  }
  if (*(long *)((long)payload + 0x58) == 0) {
    return attr_00;
  }
  pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x58));
  attr_00->defaultValue = pxVar2;
  if (attr_00->defaultValue != (xmlChar *)0x0) {
    return attr_00;
  }
LAB_0017a25f:
  xmlFreeAttribute(attr_00);
  return (void *)0x0;
}

Assistant:

static void *
xmlCopyAttribute(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlAttributePtr attr = (xmlAttributePtr) payload;
    xmlAttributePtr cur;

    cur = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlAttribute));
    cur->type = XML_ATTRIBUTE_DECL;
    cur->atype = attr->atype;
    cur->def = attr->def;
    if (attr->tree != NULL) {
        cur->tree = xmlCopyEnumeration(attr->tree);
        if (cur->tree == NULL)
            goto error;
    }
    if (attr->elem != NULL) {
	cur->elem = xmlStrdup(attr->elem);
        if (cur->elem == NULL)
            goto error;
    }
    if (attr->name != NULL) {
	cur->name = xmlStrdup(attr->name);
        if (cur->name == NULL)
            goto error;
    }
    if (attr->prefix != NULL) {
	cur->prefix = xmlStrdup(attr->prefix);
        if (cur->prefix == NULL)
            goto error;
    }
    if (attr->defaultValue != NULL) {
	cur->defaultValue = xmlStrdup(attr->defaultValue);
        if (cur->defaultValue == NULL)
            goto error;
    }
    return(cur);

error:
    xmlFreeAttribute(cur);
    return(NULL);
}